

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  size_t __n;
  char *json_00;
  size_t sVar2;
  size_t len;
  FILE *infh;
  char *json;
  int ninputs;
  int rv;
  char **inputs;
  char *command;
  char *conffile;
  ps_config_t *config;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  config = (ps_config_t *)argv;
  argv_local._0_4_ = argc;
  inputs = (char **)find_command((int *)&argv_local,argv);
  _ninputs = find_inputs((int *)&argv_local,(char **)config,(int *)&json);
  if (((((int)json == 0) && (iVar1 = strcmp((char *)inputs,"soxflags"), iVar1 != 0)) &&
      (iVar1 = strcmp((char *)inputs,"config"), iVar1 != 0)) &&
     (iVar1 = strcmp((char *)inputs,"help-config"), iVar1 != 0)) {
    usage(*(char **)config,0);
    argv_local._4_4_ = 1;
  }
  else {
    conffile = (char *)cmd_ln_parse_r((ps_config_t *)0x0,ps_main_args_def,(int)argv_local,
                                      (char **)config,0);
    if ((cmd_ln_t *)conffile == (cmd_ln_t *)0x0) {
      usage(*(char **)config,0);
      argv_local._4_4_ = 1;
    }
    else {
      ps_default_search_args((ps_config_t *)conffile);
      iVar1 = ps_config_bool((ps_config_t *)conffile,"state_align");
      if (iVar1 != 0) {
        ps_config_set_bool((ps_config_t *)conffile,"phone_align",1);
      }
      command = ps_config_str((cmd_ln_t *)conffile,"config");
      if (command != (char *)0x0) {
        __stream = fopen(command,"rt");
        if (__stream == (FILE *)0x0) {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                         ,0x305,"Failed to open config file %s",command);
          return 1;
        }
        fseek(__stream,0,2);
        __n = ftell(__stream);
        fseek(__stream,0,0);
        json_00 = (char *)__ckd_malloc__(__n + 1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                         ,0x30b);
        sVar2 = fread(json_00,1,__n,__stream);
        if (sVar2 != __n) {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                         ,0x30d,"Failed to read config file %s",command);
          ckd_free(json_00);
          fclose(__stream);
          return 1;
        }
        json_00[__n] = '\0';
        fclose(__stream);
        conffile = (char *)ps_config_parse_json((ps_config_t *)conffile,json_00);
        ckd_free(json_00);
        if (conffile == (char *)0x0) {
          return 1;
        }
        ps_config_set_str((ps_config_t *)conffile,"config",(char *)0x0);
      }
      iVar1 = strcmp((char *)inputs,"soxflags");
      if (iVar1 == 0) {
        json._4_4_ = soxflags((ps_config_t *)conffile);
      }
      else {
        iVar1 = strcmp((char *)inputs,"config");
        if (iVar1 == 0) {
          json._4_4_ = print_config((ps_config_t *)conffile);
        }
        else {
          iVar1 = strcmp((char *)inputs,"live");
          if (iVar1 == 0) {
            json._4_4_ = process_inputs(live,(ps_config_t *)conffile,_ninputs,(int)json);
          }
          else {
            iVar1 = strcmp((char *)inputs,"single");
            if (iVar1 == 0) {
              json._4_4_ = process_inputs(single,(ps_config_t *)conffile,_ninputs,(int)json);
            }
            else {
              iVar1 = strcmp((char *)inputs,"align");
              if (iVar1 == 0) {
                json._4_4_ = align((ps_config_t *)conffile,_ninputs,(int)json);
              }
              else {
                iVar1 = strcmp((char *)inputs,"help");
                if (iVar1 == 0) {
                  json._4_4_ = 0;
                  usage(*(char **)config,0);
                }
                else {
                  iVar1 = strcmp((char *)inputs,"help-config");
                  if (iVar1 != 0) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                            ,0x32d,"Unknown command \"%s\"\n",inputs);
                    return 1;
                  }
                  json._4_4_ = 0;
                  usage(*(char **)config,1);
                }
              }
            }
          }
        }
      }
      ps_config_free((ps_config_t *)conffile);
      argv_local._4_4_ = json._4_4_;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[])
{
    ps_config_t *config;
    const char *conffile;
    char *command;
    char **inputs;
    int rv, ninputs;

    command = find_command(&argc, argv);
    inputs = find_inputs(&argc, argv, &ninputs);
    /* Only soxflags and config take no arguments */
    if (ninputs == 0) {
        if ((0 != strcmp(command, "soxflags"))
            && 0 != strcmp(command, "config")
            && 0 != strcmp(command, "help-config")) {
            usage(argv[0], FALSE);
            return 1;
        }
    }
    /* If arg parsing fails */
    if ((config = ps_config_parse_args(ps_main_args_def, argc, argv)) == NULL) {
        usage(argv[0], FALSE);
        return 1;
    }
    ps_default_search_args(config);
    if (ps_config_bool(config, "state_align"))
        ps_config_set_bool(config, "phone_align", TRUE);
    if ((conffile = ps_config_str(config, "config")) != NULL) {
        char *json;
        FILE *infh;
        size_t len;
        if ((infh = fopen(conffile, "rt")) == NULL) {
            E_ERROR_SYSTEM("Failed to open config file %s", conffile);
            return 1;
        }
        fseek(infh, 0, SEEK_END);
        len = (size_t)ftell(infh);
        fseek(infh, 0, SEEK_SET);
        json = ckd_malloc(len + 1);
        if (fread(json, 1, len, infh) != len) {
            E_ERROR_SYSTEM("Failed to read config file %s", conffile);
            ckd_free(json);
            fclose(infh);
            return 1;
        }
        json[len] = '\0';
        fclose(infh);
        config = ps_config_parse_json(config, json);
        ckd_free(json);
        if (config == NULL)
            return 1;
        ps_config_set_str(config, "config", NULL);
    }
    if (0 == strcmp(command, "soxflags"))
        rv = soxflags(config);
    else if (0 == strcmp(command, "config"))
        rv = print_config(config);
    else if (0 == strcmp(command, "live"))
        rv = process_inputs(live, config, inputs, ninputs);
    else if (0 == strcmp(command, "single"))
        rv = process_inputs(single, config, inputs, ninputs);
    else if (0 == strcmp(command, "align"))
        rv = align(config, inputs, ninputs);
    else if (0 == strcmp(command, "help")) {
        rv = 0;
        usage(argv[0], FALSE);
    }
    else if (0 == strcmp(command, "help-config")) {
        rv = 0;
        usage(argv[0], TRUE);
    }
    else {
        E_ERROR("Unknown command \"%s\"\n", command);
        return 1;
    }

    ps_config_free(config);
    return rv;
}